

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

size_t __thiscall
absl::lts_20250127::container_internal::CommonFields::alloc_size
          (CommonFields *this,size_t slot_size,size_t slot_align)

{
  RawHashSetLayout local_30;
  
  RawHashSetLayout::RawHashSetLayout
            (&local_30,this->capacity_,slot_align,(bool)((byte)(int)this->size_ & 1));
  if (slot_size <= ~local_30.slot_offset_ / local_30.capacity_) {
    return local_30.capacity_ * slot_size + local_30.slot_offset_;
  }
  __assert_fail("(slot_size <= ((std::numeric_limits<size_t>::max)() - slot_offset_) / capacity_) && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x4cf,"size_t absl::container_internal::RawHashSetLayout::alloc_size(size_t) const"
               );
}

Assistant:

size_t alloc_size(size_t slot_size, size_t slot_align) const {
    return RawHashSetLayout(capacity(), slot_align, has_infoz())
        .alloc_size(slot_size);
  }